

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O2

void helper_cas2w_m68k(CPUM68KState_conflict *env,uint32_t regs,uint32_t a1,uint32_t a2)

{
  uint32_t uVar1;
  undefined4 uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint uVar6;
  short sVar7;
  short sVar8;
  uint uVar9;
  short sVar10;
  uint32_t uVar11;
  uintptr_t unaff_retaddr;
  short local_44;
  short local_40;
  
  uVar6 = regs >> 9 & 7;
  uVar9 = regs >> 6 & 7;
  uVar11 = (uint32_t)(short)env->dregs[uVar6];
  uVar1 = env->dregs[uVar9];
  uVar2 = *(undefined4 *)((long)env->dregs + (ulong)(regs >> 1 & 0x1c));
  uVar3 = env->dregs[regs & 7];
  uVar4 = cpu_lduw_data_ra_m68k(env,a1,unaff_retaddr);
  uVar5 = cpu_lduw_data_ra_m68k(env,a2,unaff_retaddr);
  sVar8 = (short)uVar4;
  sVar7 = (short)uVar5;
  if ((int)sVar8 == uVar11) {
    sVar10 = (short)uVar1;
    if (sVar7 == sVar10) {
      local_44 = (short)uVar2;
      cpu_stw_data_ra_m68k(env,a1,(int)local_44,unaff_retaddr);
      local_40 = (short)uVar3;
      cpu_stw_data_ra_m68k(env,a2,(int)local_40,unaff_retaddr);
    }
    env->cc_n = (int)sVar7;
    uVar11 = (uint32_t)sVar10;
  }
  else {
    env->cc_n = (int)sVar8;
  }
  env->cc_v = uVar11;
  env->cc_op = 9;
  *(short *)(env->dregs + uVar6) = sVar8;
  *(short *)(env->dregs + uVar9) = sVar7;
  return;
}

Assistant:

void HELPER(cas2w)(CPUM68KState *env, uint32_t regs, uint32_t a1, uint32_t a2)
{
    uint32_t Dc1 = extract32(regs, 9, 3);
    uint32_t Dc2 = extract32(regs, 6, 3);
    uint32_t Du1 = extract32(regs, 3, 3);
    uint32_t Du2 = extract32(regs, 0, 3);
    int16_t c1 = env->dregs[Dc1];
    int16_t c2 = env->dregs[Dc2];
    int16_t u1 = env->dregs[Du1];
    int16_t u2 = env->dregs[Du2];
    int16_t l1, l2;
    uintptr_t ra = GETPC();

    l1 = cpu_lduw_data_ra(env, a1, ra);
    l2 = cpu_lduw_data_ra(env, a2, ra);
    if (l1 == c1 && l2 == c2) {
        cpu_stw_data_ra(env, a1, u1, ra);
        cpu_stw_data_ra(env, a2, u2, ra);
    }

    if (c1 != l1) {
        env->cc_n = l1;
        env->cc_v = c1;
    } else {
        env->cc_n = l2;
        env->cc_v = c2;
    }
    env->cc_op = CC_OP_CMPW;
    env->dregs[Dc1] = deposit32(env->dregs[Dc1], 0, 16, l1);
    env->dregs[Dc2] = deposit32(env->dregs[Dc2], 0, 16, l2);
}